

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::StreamArchive::decode_payload_uncompressed
          (StreamArchive *this,void *blob,size_t blob_size,Entry *entry,bool concurrent)

{
  uint32_t uVar1;
  int iVar2;
  LogLevel LVar3;
  size_t sVar4;
  mz_ulong mVar5;
  ulong __n;
  bool bVar6;
  
  if ((entry->header).uncompressed_size != blob_size) {
    return false;
  }
  if ((entry->header).payload_size != blob_size) {
    return false;
  }
  if ((concurrent) && (iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->read_lock), iVar2 != 0))
  {
    std::__throw_system_error(iVar2);
  }
  bVar6 = false;
  iVar2 = fseek((FILE *)this->file,entry->offset,0);
  if (-1 < iVar2) {
    __n = (ulong)(entry->header).payload_size;
    sVar4 = fread(blob,1,__n,(FILE *)this->file);
    bVar6 = sVar4 == __n;
  }
  if (concurrent) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->read_lock);
  }
  if (bVar6) {
    if ((entry->header).crc != 0) {
      mVar5 = mz_crc32(0,(mz_uint8 *)blob,blob_size);
      uVar1 = (entry->header).crc;
      if (uVar1 != (uint32_t)mVar5) {
        LVar3 = get_thread_log_level();
        if (((int)LVar3 < 3) &&
           (bVar6 = Internal::log_thread_callback(LOG_ERROR,"CRC mismatch!\n"), !bVar6)) {
          decode_payload_uncompressed();
        }
        if (uVar1 != (uint32_t)mVar5) goto LAB_00148db7;
      }
    }
    bVar6 = true;
  }
  else {
LAB_00148db7:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool decode_payload_uncompressed(void *blob, size_t blob_size, const Entry &entry, bool concurrent)
	{
		if (entry.header.uncompressed_size != blob_size || entry.header.payload_size != blob_size)
			return false;

		{
			ConditionalLockGuard holder(read_lock, concurrent);
			if (fseek(file, entry.offset, SEEK_SET) < 0)
				return false;

			size_t read_size = entry.header.payload_size;
			if (fread(blob, 1, read_size, file) != read_size)
				return false;
		}

		if (entry.header.crc != 0) // Verify checksum.
		{
			auto disk_crc = uint32_t(mz_crc32(MZ_CRC32_INIT, static_cast<unsigned char *>(blob), blob_size));
			if (disk_crc != entry.header.crc)
			{
				LOGE_LEVEL("CRC mismatch!\n");
				return false;
			}
		}

		return true;
	}